

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatOrderH.c
# Opt level: O0

void Msat_HeapPercolateUp(Msat_Order_t *p,int i)

{
  double *pdVar1;
  double dVar2;
  int iVar3;
  bool bVar4;
  int iVar5;
  int local_14;
  int x;
  int i_local;
  Msat_Order_t *p_local;
  
  iVar3 = p->vHeap->pArray[i];
  local_14 = i;
  while( true ) {
    iVar5 = local_14 >> 1;
    bVar4 = false;
    if (iVar5 != 0) {
      dVar2 = p->pSat->pdActivity[iVar3];
      pdVar1 = p->pSat->pdActivity + p->vHeap->pArray[iVar5];
      bVar4 = *pdVar1 <= dVar2 && dVar2 != *pdVar1;
    }
    if (!bVar4) break;
    p->vHeap->pArray[local_14] = p->vHeap->pArray[iVar5];
    p->vIndex->pArray[p->vHeap->pArray[local_14]] = local_14;
    local_14 = iVar5;
  }
  p->vHeap->pArray[local_14] = iVar3;
  p->vIndex->pArray[iVar3] = local_14;
  return;
}

Assistant:

void Msat_HeapPercolateUp( Msat_Order_t * p, int i )
{
    int x = HHEAP(p, i);
    while ( HPARENT(i) != 0 && HCOMPARE(p, x, HHEAP(p, HPARENT(i))) )
    {
        p->vHeap->pArray[i]            = HHEAP(p, HPARENT(i));
        p->vIndex->pArray[HHEAP(p, i)] = i;
        i                              = HPARENT(i);
    }
    p->vHeap->pArray[i]  = x;
    p->vIndex->pArray[x] = i;
}